

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_parse_url_path(Curl_easy *data)

{
  byte *pbVar1;
  uchar uVar2;
  connectdata *pcVar3;
  FILEPROTO *pFVar4;
  curl_trc_feat *pcVar5;
  bool bVar6;
  CURLcode CVar7;
  int iVar8;
  char **ppcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  byte bVar15;
  size_t sVar16;
  bool bVar17;
  char *rawPath;
  size_t pathLen;
  char *local_50;
  size_t local_48;
  Curl_easy *local_40;
  FILEPROTO *local_38;
  
  pcVar3 = data->conn;
  pFVar4 = (data->req).p.file;
  local_50 = (char *)0x0;
  local_48 = 0;
  pbVar1 = (byte *)((long)&pcVar3->proto + 0x112);
  *pbVar1 = *pbVar1 & 0xeb;
  CVar7 = Curl_urldecode(pFVar4->path,0,&local_50,&local_48,REJECT_CTRL);
  pcVar12 = local_50;
  if (CVar7 != CURLE_OK) {
    Curl_failf(data,"path contains control characters");
    return CVar7;
  }
  uVar2 = (data->set).ftp_filemethod;
  local_38 = pFVar4;
  if (uVar2 == '\x03') {
    pcVar11 = strrchr(local_50,0x2f);
    pcVar10 = pcVar12;
    if (pcVar11 != (char *)0x0) {
      ppcVar9 = (char **)(*Curl_ccalloc)(1,8);
      (pcVar3->proto).ftpc.dirs = ppcVar9;
      if (ppcVar9 != (char **)0x0) {
        sVar16 = (long)pcVar11 - (long)pcVar12;
        if (sVar16 == 0) {
          sVar16 = 1;
        }
        pcVar12 = (char *)Curl_memdup0(local_50,sVar16);
        *(pcVar3->proto).ftpc.dirs = pcVar12;
        if (*(pcVar3->proto).ftpc.dirs != (char *)0x0) {
          (pcVar3->proto).ftpc.dirdepth = 1;
          bVar17 = true;
          pcVar12 = pcVar11 + 1;
          pFVar4 = local_38;
          goto joined_r0x0012de9d;
        }
      }
      (*Curl_cfree)(local_50);
      bVar17 = false;
      pcVar12 = (char *)0x0;
      pFVar4 = local_38;
      goto joined_r0x0012de9d;
    }
  }
  else {
    if (uVar2 != '\x02') {
      sVar16 = 0;
      pcVar10 = local_50;
      do {
        if (*pcVar10 == '/') {
          sVar16 = sVar16 + 1;
        }
        else if (*pcVar10 == '\0') goto LAB_0012ddc2;
        pcVar10 = pcVar10 + 1;
      } while( true );
    }
    if (local_48 == 0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (char *)0x0;
      if (local_50[local_48 - 1] != '/') {
        pcVar10 = pcVar12;
      }
    }
  }
  goto LAB_0012ded2;
LAB_0012ddc2:
  local_40 = data;
  if (sVar16 == 0) {
    bVar17 = true;
  }
  else {
    ppcVar9 = (char **)(*Curl_ccalloc)(sVar16,8);
    (pcVar3->proto).ftpc.dirs = ppcVar9;
    if (ppcVar9 == (char **)0x0) {
      (*Curl_cfree)(local_50);
      bVar17 = false;
      data = local_40;
      pcVar12 = (char *)0x0;
      pFVar4 = local_38;
    }
    else {
      do {
        pcVar10 = strchr(pcVar12,0x2f);
        bVar17 = pcVar10 == (char *)0x0;
        data = local_40;
        pFVar4 = local_38;
        if (bVar17) goto joined_r0x0012de9d;
        sVar16 = (long)pcVar10 - (long)pcVar12;
        if (sVar16 == 0) {
          sVar16 = (size_t)((pcVar3->proto).ftpc.dirdepth == 0);
        }
        if (sVar16 == 0) {
LAB_0012de67:
          pcVar12 = pcVar10 + 1;
          bVar6 = true;
        }
        else {
          pcVar11 = (char *)Curl_memdup0(pcVar12,sVar16);
          if (pcVar11 != (char *)0x0) {
            iVar8 = (pcVar3->proto).ftpc.dirdepth;
            (pcVar3->proto).ftpc.dirdepth = iVar8 + 1;
            (pcVar3->proto).ftpc.dirs[iVar8] = pcVar11;
            goto LAB_0012de67;
          }
          (*Curl_cfree)(local_50);
          bVar6 = false;
        }
      } while (bVar6);
      data = local_40;
      pcVar12 = (char *)0x0;
      pFVar4 = local_38;
    }
  }
joined_r0x0012de9d:
  pcVar10 = pcVar12;
  local_38 = pFVar4;
  if (!bVar17) {
    return CURLE_OUT_OF_MEMORY;
  }
LAB_0012ded2:
  if ((pcVar10 == (char *)0x0) || (*pcVar10 == '\0')) {
    pcVar12 = (char *)0x0;
  }
  else {
    pcVar12 = (*Curl_cstrdup)(pcVar10);
  }
  sVar16 = local_48;
  (pcVar3->proto).ftpc.file = pcVar12;
  if (((((data->state).field_0x776 & 2) != 0) && ((pcVar3->proto).ftpc.file == (char *)0x0)) &&
     (local_38->fd == 0)) {
    Curl_failf(data,"Uploading to a URL without a filename");
    (*Curl_cfree)(local_50);
    return CURLE_URL_MALFORMAT;
  }
  bVar15 = *(byte *)((long)&pcVar3->proto + 0x112);
  *(byte *)((long)&pcVar3->proto + 0x112) = bVar15 & 0xf7;
  uVar2 = (data->set).ftp_filemethod;
  if ((uVar2 != '\x02') || (*local_50 != '/')) {
    if (((ulong)pcVar3->bits & 0x40) == 0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (pcVar3->proto).ftpc.prevpath;
    }
    if (pcVar12 == (char *)0x0) goto LAB_0012dfec;
    if (uVar2 == '\x02') {
      sVar13 = 0;
    }
    else {
      pcVar10 = (pcVar3->proto).ftpc.file;
      if (pcVar10 == (char *)0x0) {
        sVar13 = 0;
      }
      else {
        sVar13 = strlen(pcVar10);
      }
      sVar13 = sVar16 - sVar13;
    }
    sVar14 = strlen(pcVar12);
    if ((sVar14 != sVar13) || (iVar8 = strncmp(local_50,pcVar12,sVar13), iVar8 != 0))
    goto LAB_0012dfec;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
      Curl_infof(data,"Request has same path as previous transfer");
    }
    bVar15 = *(byte *)((long)&pcVar3->proto + 0x112);
  }
  *(byte *)((long)&pcVar3->proto + 0x112) = bVar15 | 8;
LAB_0012dfec:
  (*Curl_cfree)(local_50);
  return CURLE_OK;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct Curl_easy *data)
{
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slashPos = NULL;
  const char *fileName = NULL;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL; /* url-decoded "raw" path */
  size_t pathLen = 0;

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  /* url-decode ftp path before further evaluation */
  result = Curl_urldecode(ftp->path, 0, &rawPath, &pathLen, REJECT_CTRL);
  if(result) {
    failf(data, "path contains control characters");
    return result;
  }

  switch(data->set.ftp_filemethod) {
    case FTPFILE_NOCWD: /* fastest, but less standard-compliant */

      if((pathLen > 0) && (rawPath[pathLen - 1] != '/'))
        fileName = rawPath;  /* this is a full file path */
      /*
        else: ftpc->file is not used anywhere other than for operations on
              a file. In other words, never for directory operations.
              So we can safely leave filename as NULL here and use it as a
              argument in dir/file decisions.
      */
      break;

    case FTPFILE_SINGLECWD:
      slashPos = strrchr(rawPath, '/');
      if(slashPos) {
        /* get path before last slash, except for / */
        size_t dirlen = slashPos - rawPath;
        if(dirlen == 0)
          dirlen = 1;

        ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirs[0] = Curl_memdup0(rawPath, dirlen);
        if(!ftpc->dirs[0]) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirdepth = 1; /* we consider it to be a single dir */
        fileName = slashPos + 1; /* rest is filename */
      }
      else
        fileName = rawPath; /* filename only (or empty) */
      break;

    default: /* allow pretty much anything */
    case FTPFILE_MULTICWD: {
      /* current position: begin of next path component */
      const char *curPos = rawPath;

      /* number of entries allocated for the 'dirs' array */
      size_t dirAlloc = 0;
      const char *str = rawPath;
      for(; *str != 0; ++str)
        if(*str == '/')
          ++dirAlloc;

      if(dirAlloc) {
        ftpc->dirs = calloc(dirAlloc, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        /* parse the URL path into separate path components */
        while((slashPos = strchr(curPos, '/'))) {
          size_t compLen = slashPos - curPos;

          /* path starts with a slash: add that as a directory */
          if((compLen == 0) && (ftpc->dirdepth == 0))
            ++compLen;

          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) does not
             work on many servers and b) has no effect on the others. */
          if(compLen > 0) {
            char *comp = Curl_memdup0(curPos, compLen);
            if(!comp) {
              free(rawPath);
              return CURLE_OUT_OF_MEMORY;
            }
            ftpc->dirs[ftpc->dirdepth++] = comp;
          }
          curPos = slashPos + 1;
        }
      }
      DEBUGASSERT((size_t)ftpc->dirdepth <= dirAlloc);
      fileName = curPos; /* the rest is the filename (or empty) */
    }
    break;
  } /* switch */

  if(fileName && *fileName)
    ftpc->file = strdup(fileName);
  else
    ftpc->file = NULL; /* instead of point to a zero byte,
                            we make it a NULL pointer */

  if(data->state.upload && !ftpc->file && (ftp->transfer == PPTRANSFER_BODY)) {
    /* We need a filename when uploading. Return error! */
    failf(data, "Uploading to a URL without a filename");
    free(rawPath);
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
    ftpc->cwddone = TRUE; /* skip CWD for absolute paths */
  else { /* newly created FTP connections are already in entry path */
    const char *oldPath = conn->bits.reuse ? ftpc->prevpath : "";
    if(oldPath) {
      size_t n = pathLen;
      if(data->set.ftp_filemethod == FTPFILE_NOCWD)
        n = 0; /* CWD to entry for relative paths */
      else
        n -= ftpc->file ? strlen(ftpc->file) : 0;

      if((strlen(oldPath) == n) && !strncmp(rawPath, oldPath, n)) {
        infof(data, "Request has same path as previous transfer");
        ftpc->cwddone = TRUE;
      }
    }
  }

  free(rawPath);
  return CURLE_OK;
}